

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

QRect __thiscall QComboBoxPrivate::popupGeometry(QComboBoxPrivate *this,QPoint *globalPosition)

{
  QWidget *widget;
  bool bVar1;
  QRect QVar2;
  
  widget = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  bVar1 = QStylePrivate::useFullScreenForPopup();
  if (bVar1) {
    QVar2 = QWidgetPrivate::screenGeometry(widget,globalPosition,true);
    return QVar2;
  }
  QVar2 = QWidgetPrivate::availableScreenGeometry(widget,globalPosition,true);
  return QVar2;
}

Assistant:

QRect QComboBoxPrivate::popupGeometry(const QPoint &globalPosition) const
{
    Q_Q(const QComboBox);
    return QStylePrivate::useFullScreenForPopup()
        ? QWidgetPrivate::screenGeometry(q, globalPosition)
        : QWidgetPrivate::availableScreenGeometry(q, globalPosition);
}